

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

ElementTypeAndOffset * __thiscall
choc::value::Type::ComplexArray::getElementInfo
          (ElementTypeAndOffset *__return_storage_ptr__,ComplexArray *this,uint32_t index)

{
  Content *pCVar1;
  undefined8 *puVar2;
  MainType MVar3;
  MainType MVar4;
  int iVar5;
  uint uVar6;
  RepeatedGroup *pRVar7;
  ComplexArray *other;
  Object *other_00;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *puVar11;
  Object *this_00;
  long lVar12;
  Allocator *pAVar13;
  long lVar14;
  size_t sVar15;
  size_t sVar16;
  
  uVar10 = (ulong)(this->groups).size;
  MVar3 = (__return_storage_ptr__->elementType).mainType;
  if (uVar10 != 0) {
    pRVar7 = (this->groups).items;
    pCVar1 = &(__return_storage_ptr__->elementType).content;
    pAVar13 = (__return_storage_ptr__->elementType).allocator;
    sVar16 = __return_storage_ptr__->offset;
    lVar14 = 0;
    lVar12 = 0;
    do {
      MVar4 = (&(pRVar7->elementType).mainType)[lVar14];
      sVar15 = 4;
      if (MVar4 < string) {
        switch(MVar4) {
        case void_:
          sVar15 = 0;
          break;
        case boolean:
          sVar15 = 1;
          break;
        case ~(complexArray|primitiveArray|vector|int64|int32|boolean):
        case ~(complexArray|primitiveArray|vector|int64|int32):
        case int32|boolean:
        case ~(complexArray|primitiveArray|vector|int64|boolean):
        case ~(complexArray|primitiveArray|vector|int64):
switchD_001cb4d7_caseD_2:
          (__return_storage_ptr__->elementType).allocator = pAVar13;
          __return_storage_ptr__->offset = sVar16;
          (__return_storage_ptr__->elementType).mainType = MVar3;
          throwError("Invalid type");
        case int32:
          break;
        case int64:
switchD_001cb4d7_caseD_8:
          sVar15 = 8;
          break;
        default:
          if (MVar4 != float32) {
            if (MVar4 != float64) goto switchD_001cb4d7_caseD_2;
            goto switchD_001cb4d7_caseD_8;
          }
        }
      }
      else if (MVar4 < primitiveArray) {
        if (MVar4 != string) {
          if (MVar4 != vector) goto switchD_001cb4d7_caseD_2;
          sVar15 = (ulong)*(uint *)((long)&(pRVar7->elementType).content + lVar14 + 4) *
                   (ulong)((byte)(pRVar7->elementType).content.field4[lVar14] & 0xf);
        }
      }
      else if (MVar4 == primitiveArray) {
        iVar5 = *(int *)((long)&(pRVar7->elementType).content + lVar14 + 8);
        sVar15 = (ulong)*(uint *)((long)&(pRVar7->elementType).content + lVar14 + 4) *
                 (ulong)((iVar5 + (uint)(iVar5 == 0)) *
                        ((byte)(pRVar7->elementType).content.field4[lVar14] & 0xf));
      }
      else if (MVar4 == complexArray) {
        sVar15 = getValueDataSize(*(ComplexArray **)((long)&(pRVar7->elementType).content + lVar14))
        ;
      }
      else {
        if (MVar4 != object) goto switchD_001cb4d7_caseD_2;
        sVar15 = Object::getValueDataSize
                           (*(Object **)((long)&(pRVar7->elementType).content + lVar14));
      }
      uVar6 = *(uint *)((long)&pRVar7->repetitions + lVar14);
      if (index < uVar6) {
        puVar2 = (undefined8 *)((long)&(pRVar7->elementType).content + lVar14 + 8);
        puVar11 = puVar2 + -1;
        MVar3 = *(MainType *)(puVar2 + -2);
        pCVar1->object = (Object *)0x0;
        if (MVar3 == object) {
          other_00 = (Object *)*puVar11;
          this_00 = (Object *)malloc(0x28);
          Object::Object(this_00,(Allocator *)0x0,other_00);
LAB_001cb625:
          pCVar1->complexArray = (ComplexArray *)this_00;
        }
        else {
          if (MVar3 == complexArray) {
            other = (ComplexArray *)*puVar11;
            this_00 = (Object *)malloc(0x18);
            ComplexArray((ComplexArray *)this_00,(Allocator *)0x0,other);
            goto LAB_001cb625;
          }
          uVar8 = *puVar2;
          pCVar1->object = (Object *)*puVar11;
          *(undefined8 *)((long)&(__return_storage_ptr__->elementType).content + 8) = uVar8;
        }
        sVar16 = sVar15 * index + lVar12;
        pAVar13 = (Allocator *)0x0;
        uVar9 = index;
      }
      else {
        uVar9 = index - uVar6;
        lVar12 = lVar12 + sVar15 * uVar6;
      }
      if (index < uVar6) {
        (__return_storage_ptr__->elementType).allocator = pAVar13;
        __return_storage_ptr__->offset = sVar16;
        (__return_storage_ptr__->elementType).mainType = MVar3;
        return __return_storage_ptr__;
      }
      lVar14 = lVar14 + 0x28;
      index = uVar9;
    } while (uVar10 * 0x28 != lVar14);
    (__return_storage_ptr__->elementType).allocator = pAVar13;
    __return_storage_ptr__->offset = sVar16;
  }
  (__return_storage_ptr__->elementType).mainType = MVar3;
  throwError("Index out of range");
}

Assistant:

ObjectType* end() const                     { return items + size; }